

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

int BUFFER_safemalloc(BUFFER *handleptr,size_t size)

{
  uchar *puVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  puVar1 = (uchar *)malloc(size + (size == 0));
  handleptr->buffer = puVar1;
  if (puVar1 == (uchar *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x2d;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/buffer.c"
                ,"BUFFER_safemalloc",0x2c,1,"Failure allocating data");
    }
  }
  else {
    handleptr->size = size;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int BUFFER_safemalloc(BUFFER* handleptr, size_t size)
{
    int result;
    size_t sizetomalloc = size;
    if (size == 0)
    {
        sizetomalloc = 1;
    }
    handleptr->buffer = (unsigned char*)malloc(sizetomalloc);
    if (handleptr->buffer == NULL)
    {
        /*Codes_SRS_BUFFER_02_003: [If allocating memory fails, then BUFFER_create shall return NULL.]*/
        LogError("Failure allocating data");
        result = MU_FAILURE;
    }
    else
    {
        // we still consider the real buffer size is 0
        handleptr->size = size;
        result = 0;
    }
    return result;
}